

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::addImplicitElems
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *this,Type type,
          ElemListT *param_2)

{
  Module *pMVar1;
  mapped_type *pmVar2;
  pointer pTVar3;
  pointer pEVar4;
  Ok local_39;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *local_38;
  value_type *e;
  value_type *t;
  ElemListT *param_2_local;
  ParseModuleTypesCtx *this_local;
  Type type_local;
  
  t = (value_type *)param_2;
  param_2_local = (ElemListT *)this;
  this_local = (ParseModuleTypesCtx *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  e = (value_type *)
      std::
      vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ::operator[](&this->wasm->tables,(ulong)this->index);
  pMVar1 = this->wasm;
  pmVar2 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::at(this->implicitElemIndices,&this->index);
  local_38 = std::
             vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ::operator[](&pMVar1->elementSegments,(ulong)*pmVar2);
  pTVar3 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                     ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)e);
  pEVar4 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(local_38);
  (pEVar4->type).id = (pTVar3->type).id;
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_39);
  return __return_storage_ptr__;
}

Assistant:

Result<> addImplicitElems(Type type, ElemListT&&) {
    auto& t = wasm.tables[index];
    auto& e = wasm.elementSegments[implicitElemIndices.at(index)];
    e->type = t->type;
    return Ok{};
  }